

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O2

void __thiscall QPDFWriter::parseVersion(QPDFWriter *this,string *version,int *major,int *minor)

{
  int iVar1;
  ulong uVar2;
  string tmp;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  iVar1 = QUtil::string_to_int((version->_M_dataplus)._M_p);
  *major = iVar1;
  *minor = 0;
  uVar2 = std::__cxx11::string::find((char)version,0x2e);
  if ((uVar2 != 0xffffffffffffffff) && (uVar2 < version->_M_string_length)) {
    std::__cxx11::string::substr((ulong)&tmp,(ulong)version);
    iVar1 = QUtil::string_to_int(tmp._M_dataplus._M_p);
    *minor = iVar1;
    std::__cxx11::string::~string((string *)&tmp);
  }
  std::__cxx11::to_string(&local_40,*major);
  std::operator+(&local_60,&local_40,".");
  std::__cxx11::to_string(&local_80,*minor);
  std::operator+(&tmp,&local_60,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  std::operator!=(&tmp,version);
  std::__cxx11::string::~string((string *)&tmp);
  return;
}

Assistant:

void
QPDFWriter::parseVersion(std::string const& version, int& major, int& minor) const
{
    major = QUtil::string_to_int(version.c_str());
    minor = 0;
    size_t p = version.find('.');
    if ((p != std::string::npos) && (version.length() > p)) {
        minor = QUtil::string_to_int(version.substr(p + 1).c_str());
    }
    std::string tmp = std::to_string(major) + "." + std::to_string(minor);
    if (tmp != version) {
        // The version number in the input is probably invalid. This happens with some files that
        // are designed to exercise bugs, such as files in the fuzzer corpus. Unfortunately
        // QPDFWriter doesn't have a way to give a warning, so we just ignore this case.
    }
}